

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_turn_undead(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  byte *pbVar1;
  short sVar2;
  CHAR_DATA *pCVar3;
  bool bVar4;
  CHAR_DATA *pCVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  bVar4 = is_evil(ch);
  if (bVar4) {
    act("$n turns $s unholy influence upon the room.",ch,(void *)0x0,(void *)0x0,0);
    send_to_char("You turn your unholy influence upon those in the room.\n\r",ch);
    iVar6 = level;
  }
  else {
    act("$n raises $s hands and calls upon the gods to destroy the unholy.",ch,(void *)0x0,
        (void *)0x0,0);
    act("You raise your hands and call upon the gods to destroy the unholy.",ch,(void *)0x0,
        (void *)0x0,3);
    bVar4 = is_good(ch);
    iVar6 = level + -3;
    if (bVar4) {
      iVar6 = level;
    }
  }
  bVar4 = is_evil(ch);
  if (bVar4) {
    if (char_list == (CHAR_DATA *)0x0) {
      iVar8 = 0;
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      iVar8 = 0;
      pCVar5 = char_list;
      do {
        if (((pCVar5->master == ch) && (pCVar5 != ch)) && ((pCVar5->act[0] & 0x4000U) != 0)) {
          iVar6 = iVar6 + 1;
          iVar8 = iVar8 + pCVar5->level;
        }
        pCVar5 = pCVar5->next;
      } while (pCVar5 != (CHAR_DATA *)0x0);
    }
    pCVar5 = ch->in_room->people;
    while (pCVar3 = pCVar5, pCVar3 != (CHAR_DATA *)0x0) {
      pCVar5 = pCVar3->next_in_room;
      bVar4 = is_same_group(pCVar3,ch);
      if (((!bVar4) && ((pCVar3->act[0] & 0x4000) != 0)) &&
         (bVar4 = is_affected_by(pCVar3,0x12), !bVar4)) {
        sVar2 = ch->level;
        iVar7 = (int)sVar2;
        if ((((SBORROW4(iVar7 * 3,iVar8 * 2) != iVar7 * 3 + iVar8 * -2 < 0) ||
             ((sVar2 < 0x14 && (0 < iVar6)))) || ((sVar2 < 0x28 && (1 < iVar6)))) ||
           ((((sVar2 < 0x33 && (2 < iVar6)) || (iVar7 < pCVar3->level + 10)) ||
            ((bVar4 = saves_spell(iVar7,pCVar3,0x10), bVar4 || (bVar4 = is_npc(pCVar3), !bVar4))))))
        {
          act("You attempt to control $N but do not have the influence.",ch,(void *)0x0,pCVar3,3);
        }
        else {
          act("$n stares in hatred for a moment then suddenly becomes very subdued.",pCVar3,
              (void *)0x0,(void *)0x0,1);
          stop_fighting(pCVar3,true);
          pCVar3->master = ch;
          pCVar3->leader = ch;
          pbVar1 = (byte *)((long)pCVar3->affected_by + 2);
          *pbVar1 = *pbVar1 | 4;
          *(byte *)pCVar3->act = (byte)pCVar3->act[0] & 0xdf;
          act("$N now follows you.",ch,(void *)0x0,pCVar3,3);
          iVar6 = iVar6 + 1;
          iVar8 = iVar8 + pCVar3->level;
        }
      }
    }
  }
  else {
    pCVar5 = ch->in_room->people;
    if (pCVar5 != (CHAR_DATA *)0x0) {
      iVar8 = 0;
      do {
        pCVar3 = pCVar5->next_in_room;
        bVar4 = is_same_group(pCVar5,ch);
        if ((!bVar4) && ((pCVar5->act[0] & 0x4000) != 0)) {
          sVar2 = pCVar5->level;
          bVar4 = is_good(ch);
          if (bVar4) {
            iVar8 = iVar6 - sVar2;
            if (iVar8 < 8) {
              iVar8 = 7;
            }
            iVar8 = dice(iVar6,iVar8 + 6);
          }
          if ((((pCVar5->level + 0xf < (int)ch->level) && (bVar4 = is_npc(pCVar5), bVar4)) &&
              (bVar4 = is_good(ch), bVar4)) ||
             (((pCVar5->level + 0x14 < (int)ch->level && (bVar4 = is_npc(pCVar5), bVar4)) ||
              ((bVar4 = is_good(ch), bVar4 &&
               ((bVar4 = is_npc(pCVar5), bVar4 && (iVar7 = number_percent(), iVar7 < 5)))))))) {
            act("$N crumbles to dust from the power of $n\'s turning.",ch,(void *)0x0,pCVar5,0);
            act("$N\'s body crumbles to dust from the power of your turning.",ch,(void *)0x0,pCVar5,
                3);
            raw_kill(ch,pCVar5);
          }
          else {
            bVar4 = saves_spell(iVar6,pCVar5,10);
            iVar7 = iVar8 / 2;
            if (!bVar4) {
              iVar7 = iVar8;
            }
            damage_old(ch,pCVar5,iVar7,sn,10,true);
          }
        }
        pCVar5 = pCVar3;
      } while (pCVar3 != (CHAR_DATA *)0x0);
    }
  }
  return;
}

Assistant:

void spell_turn_undead(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	CHAR_DATA *v_next;
	int dam = 0;
	int value, count, num;
	CHAR_DATA *follower;

	follower = nullptr; /* follower, count and num used for evil clerics */
	count = 0;
	num = 0;

	if (!is_evil(ch))
	{
		act("$n raises $s hands and calls upon the gods to destroy the unholy.", ch, nullptr, nullptr, TO_ROOM);
		act("You raise your hands and call upon the gods to destroy the unholy.", ch, nullptr, nullptr, TO_CHAR);

		if (!is_good(ch))
			level -= 3;
	}
	else
	{
		act("$n turns $s unholy influence upon the room.", ch, 0, 0, TO_ROOM);
		send_to_char("You turn your unholy influence upon those in the room.\n\r", ch);
	}

	/*
	if (!is_npc(ch) && ch->pcdata->special == SPEC_PALADIN_HUNTER)
		level += number_range(2,level/7);
	*/

	if (!is_evil(ch))
	{
		for (victim = ch->in_room->people; victim != nullptr; victim = v_next)
		{
			v_next = victim->next_in_room;

			if (is_same_group(victim, ch) || !IS_SET(victim->act, ACT_UNDEAD))
				continue;

			value = std::max(1, level - victim->level + 10);
			value = std::max(13, value - 4);

			if (is_good(ch))
				dam = dice(level, value);

			if (((ch->level > (victim->level + 15)) && is_npc(victim) && is_good(ch))
				|| ((ch->level > (victim->level + 20)) && is_npc(victim))
				|| (is_good(ch) && is_npc(victim) && number_percent() < 5))
			{
				act("$N crumbles to dust from the power of $n's turning.", ch, nullptr, victim, TO_ROOM);
				act("$N's body crumbles to dust from the power of your turning.", ch, nullptr, victim, TO_CHAR);
				raw_kill(ch, victim);
			}
			else
			{

				damage_old(ch, victim, saves_spell(level, victim, DAM_HOLY) ? dam / 2 : dam, sn, DAM_HOLY, true);
			}
		}

		return;
	}
	else
	{
		for (follower = char_list; follower != nullptr; follower = follower->next)
		{
			if (follower->master == ch && IS_SET(follower->act, ACT_UNDEAD) && follower != ch)
			{
				num++;
				count += follower->level;
			}
		}

		for (victim = ch->in_room->people; victim != nullptr; victim = v_next)
		{
			v_next = victim->next_in_room;

			if (is_same_group(victim, ch) || !IS_SET(victim->act, ACT_UNDEAD))
				continue;

			if (is_affected_by(victim, AFF_CHARM))
				continue;

			if ((ch->level * 3 < count * 2)
				|| (ch->level < 20 && num > 0)
				|| (ch->level < 40 && num > 1)
				|| (ch->level < 51 && num > 2)
				|| (ch->level < (victim->level + 10))
				|| saves_spell(ch->level, victim, DAM_OTHER)
				|| !is_npc(victim))
			{
				act("You attempt to control $N but do not have the influence.", ch, 0, victim, TO_CHAR);
				continue;
			}
			else
			{
				act("$n stares in hatred for a moment then suddenly becomes very subdued.", victim, 0, 0, TO_NOTVICT);
				stop_fighting(victim, true);

				victim->master = ch;
				victim->leader = ch;

				SET_BIT(victim->affected_by, AFF_CHARM);
				REMOVE_BIT(victim->act, ACT_AGGRESSIVE);

				act("$N now follows you.", ch, 0, victim, TO_CHAR);

				num++;
				count += victim->level;
			}
		}
	}
}